

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O3

pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* helics::core::extractCoreType_abi_cxx11_(int argc,char **argv)

{
  string_view type;
  CoreType CVar1;
  pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  string namestring;
  string corestring;
  char *in_stack_ffffffffffffff88;
  helicsCLI11App *local_70;
  int local_64;
  string local_60;
  string local_40;
  char **local_20;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  anon_unknown_5::makeCLITypeApp((anon_unknown_5 *)&local_70,&local_40,&local_60);
  helicsCLI11App::helics_parse<int&,char**&>(local_70,&local_64,&local_20);
  if (local_40._M_string_length == 0) {
    in_RDI->first = DEFAULT;
    (in_RDI->second)._M_dataplus._M_p = (pointer)&(in_RDI->second).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&in_RDI->second,local_60._M_dataplus._M_p,
               local_60._M_dataplus._M_p + local_60._M_string_length);
  }
  else {
    type._M_str = in_stack_ffffffffffffff88;
    type._M_len = 0x369c83;
    CVar1 = coreTypeFromString(type);
    in_RDI->first = CVar1;
    (in_RDI->second)._M_dataplus._M_p = (pointer)&(in_RDI->second).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&in_RDI->second,local_60._M_dataplus._M_p,
               local_60._M_dataplus._M_p + local_60._M_string_length);
  }
  if (local_70 != (helicsCLI11App *)0x0) {
    (*(local_70->super_App)._vptr_App[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return in_RDI;
}

Assistant:

std::pair<CoreType, std::string> extractCoreType(int argc, char* argv[])
{
    std::string corestring;
    std::string namestring;
    auto app = makeCLITypeApp(corestring, namestring);
    app->helics_parse(argc, argv);
    if (corestring.empty()) {
        return {CoreType::DEFAULT, namestring};
    }
    return {coreTypeFromString(corestring), namestring};
}